

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationX.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CRotationX<std::complex<double>_>::CRotationX
          (CRotationX<std::complex<double>_> *this,int control,int target,real_type theta,
          int controlState)

{
  int controlState_local;
  real_type theta_local;
  int target_local;
  int control_local;
  CRotationX<std::complex<double>_> *this_local;
  
  theta_local._0_4_ = target;
  theta_local._4_4_ = control;
  _target_local = this;
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0075ae30;
  std::make_unique<qclab::qgates::RotationX<std::complex<double>>,int_const&,double_const&>
            ((int *)&this->gate_,&theta_local);
  if (theta_local._4_4_ < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationX.hpp"
                  ,0x40,
                  "qclab::qgates::CRotationX<std::complex<double>>::CRotationX(const int, const int, const real_type, const int) [T = std::complex<double>]"
                 );
  }
  if (-1 < theta_local._0_4_) {
    if (theta_local._4_4_ != theta_local._0_4_) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationX.hpp"
                  ,0x41,
                  "qclab::qgates::CRotationX<std::complex<double>>::CRotationX(const int, const int, const real_type, const int) [T = std::complex<double>]"
                 );
  }
  __assert_fail("target >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationX.hpp"
                ,0x40,
                "qclab::qgates::CRotationX<std::complex<double>>::CRotationX(const int, const int, const real_type, const int) [T = std::complex<double>]"
               );
}

Assistant:

CRotationX( const int control , const int target ,
                    const real_type theta , const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< RotationX< T > >( target , theta ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }